

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_is_subset(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint16_t *puVar5;
  byte bVar6;
  undefined1 uVar7;
  byte bVar8;
  ushort uVar9;
  long *plVar10;
  long *plVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  _Bool _Var18;
  
  iVar3 = (r1->high_low_container).size;
  if (iVar3 < 1) {
LAB_00123cce:
    _Var18 = iVar3 == 0;
  }
  else {
    uVar16 = 0;
    do {
      if ((r2->high_low_container).size <= (int)uVar16) goto LAB_00123cce;
      uVar1 = *(r1->high_low_container).keys;
      puVar5 = (r2->high_low_container).keys;
      uVar12 = uVar16 & 0xffff;
      uVar2 = puVar5[uVar12];
      if (uVar1 == uVar2) {
        bVar8 = *(r1->high_low_container).typecodes;
        plVar11 = (long *)*(r1->high_low_container).containers;
        if (bVar8 == 4) {
          bVar8 = *(byte *)(plVar11 + 1);
          plVar11 = (long *)*plVar11;
        }
        bVar6 = (r2->high_low_container).typecodes[uVar12];
        plVar10 = (long *)(r2->high_low_container).containers[uVar12];
        if (bVar6 == 4) {
          bVar6 = *(byte *)(plVar10 + 1);
          plVar10 = (long *)*plVar10;
        }
        uVar7 = (*(code *)(&DAT_00137874 +
                          *(int *)(&DAT_00137874 + (ulong)(((uint)bVar6 + (uint)bVar8 * 4) - 5) * 4)
                          ))(plVar11,plVar10);
        return (_Bool)uVar7;
      }
      if (uVar1 < uVar2) break;
      uVar4 = (r2->high_low_container).size;
      uVar12 = uVar16 + 1;
      uVar13 = uVar12;
      if (((int)uVar12 < (int)uVar4) && (puVar5[(int)uVar12] < uVar1)) {
        uVar16 = uVar16 + 2;
        iVar15 = 1;
        if ((int)uVar16 < (int)uVar4) {
          iVar14 = 1;
          do {
            uVar17 = (ulong)uVar16;
            uVar9 = puVar5[(int)uVar16];
            iVar15 = iVar14;
            if (uVar1 <= uVar9) goto LAB_00123bc6;
            iVar15 = iVar14 * 2;
            uVar16 = uVar12 + iVar14 * 2;
            iVar14 = iVar15;
          } while ((int)uVar16 < (int)uVar4);
        }
        uVar9 = puVar5[(long)(int)uVar4 + -1];
        uVar17 = (long)(int)uVar4 - 1;
LAB_00123bc6:
        uVar16 = (uint)uVar17;
        uVar13 = uVar16;
        if (((uVar9 != uVar1) && (uVar13 = uVar4, uVar1 <= uVar9)) &&
           (uVar13 = uVar16, (iVar15 >> 1) + uVar12 + 1 != uVar16)) {
          uVar12 = (iVar15 >> 1) + uVar12;
          do {
            uVar13 = (int)(uVar12 + (uint)uVar17) >> 1;
            if (puVar5[(int)uVar13] == uVar1) break;
            uVar16 = uVar13;
            if (puVar5[(int)uVar13] < uVar1) {
              uVar16 = (uint)uVar17;
              uVar12 = uVar13;
            }
            uVar17 = (ulong)uVar16;
            uVar13 = uVar16;
          } while (uVar12 + 1 != uVar16);
        }
      }
      uVar16 = uVar13;
    } while (uVar1 != uVar2);
    _Var18 = false;
  }
  return _Var18;
}

Assistant:

bool roaring_bitmap_is_subset(const roaring_bitmap_t *r1,
                              const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    const int length1 = ra1->size, length2 = ra2->size;

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(ra1, (uint16_t)pos1);
        const uint16_t s2 = ra_get_key_at_index(ra2, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 =
                ra_get_container_at_index(ra1, (uint16_t)pos1, &type1);
            container_t *c2 =
                ra_get_container_at_index(ra2, (uint16_t)pos2, &type2);
            if (!container_is_subset(c1, type1, c2, type2)) return false;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            return false;
        } else {  // s1 > s2
            pos2 = ra_advance_until(ra2, s1, pos2);
        }
    }
    if (pos1 == length1)
        return true;
    else
        return false;
}